

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkDataTypes.cpp
# Opt level: O1

int __thiscall TrodesConfig::copy(TrodesConfig *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  long lVar1;
  TrodesConfig *this_00;
  undefined8 uVar2;
  ulong uVar3;
  pointer pNVar4;
  pointer pNVar5;
  long lVar6;
  ulong uVar7;
  undefined1 local_c0 [8];
  _Alloc_hider local_b8;
  char local_a8 [16];
  int local_98;
  vector<int,_std::allocator<int>_> local_90;
  undefined1 local_78 [8];
  _Alloc_hider local_70;
  char local_60 [24];
  vector<NDeviceChannel,_std::allocator<NDeviceChannel>_> local_48;
  
  this_00 = (TrodesConfig *)operator_new(0x38);
  TrodesConfig(this_00);
  pNVar4 = (this->devices).super__Vector_base<NDevice,_std::allocator<NDevice>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar3 = ((long)(this->devices).super__Vector_base<NDevice,_std::allocator<NDevice>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)pNVar4 >> 3) * -0x71c71c71c71c71c7;
  if (0 < (int)uVar3) {
    lVar6 = 0x30;
    uVar7 = 0;
    do {
      if (uVar3 <= uVar7) goto LAB_00209ae5;
      local_78 = (undefined1  [8])&PTR__NDevice_003edce8;
      local_70._M_p = local_60;
      lVar1 = *(long *)((long)pNVar4 + lVar6 + -0x28);
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,lVar1,*(long *)((long)pNVar4 + lVar6 + -0x20) + lVar1);
      local_60._16_8_ = *(undefined8 *)((long)pNVar4 + lVar6 + -8);
      std::vector<NDeviceChannel,_std::allocator<NDeviceChannel>_>::vector
                (&local_48,
                 (vector<NDeviceChannel,_std::allocator<NDeviceChannel>_> *)
                 ((long)&(pNVar4->super_NetworkDataType)._vptr_NetworkDataType + lVar6));
      std::vector<NDevice,_std::allocator<NDevice>_>::push_back
                (&this_00->devices,(NDevice *)local_78);
      NDevice::~NDevice((NDevice *)local_78);
      uVar7 = uVar7 + 1;
      pNVar4 = (this->devices).super__Vector_base<NDevice,_std::allocator<NDevice>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar3 = ((long)(this->devices).super__Vector_base<NDevice,_std::allocator<NDevice>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pNVar4 >> 3) * -0x71c71c71c71c71c7;
      lVar6 = lVar6 + 0x48;
    } while ((long)uVar7 < (long)(int)uVar3);
  }
  pNVar5 = (this->nTrodes).super__Vector_base<NTrodeObj,_std::allocator<NTrodeObj>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar3 = ((long)(this->nTrodes).super__Vector_base<NTrodeObj,_std::allocator<NTrodeObj>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)pNVar5 >> 3) * -0x71c71c71c71c71c7;
  if (0 < (int)uVar3) {
    lVar6 = 0x30;
    uVar7 = 0;
    do {
      if (uVar3 <= uVar7) {
LAB_00209ae5:
        uVar2 = std::__throw_out_of_range_fmt
                          ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                           ,uVar7);
        operator_delete(this_00,0x38);
        _Unwind_Resume(uVar2);
      }
      local_c0 = (undefined1  [8])&PTR__NTrodeObj_003edd18;
      local_b8._M_p = local_a8;
      lVar1 = *(long *)((long)pNVar5 + lVar6 + -0x28);
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b8,lVar1,*(long *)((long)pNVar5 + lVar6 + -0x20) + lVar1);
      local_98 = *(int *)((long)pNVar5 + lVar6 + -8);
      std::vector<int,_std::allocator<int>_>::vector
                (&local_90,
                 (vector<int,_std::allocator<int>_> *)
                 ((long)&(pNVar5->super_NetworkDataType)._vptr_NetworkDataType + lVar6));
      std::vector<NTrodeObj,_std::allocator<NTrodeObj>_>::push_back
                (&this_00->nTrodes,(NTrodeObj *)local_c0);
      NTrodeObj::~NTrodeObj((NTrodeObj *)local_c0);
      uVar7 = uVar7 + 1;
      pNVar5 = (this->nTrodes).super__Vector_base<NTrodeObj,_std::allocator<NTrodeObj>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar3 = ((long)(this->nTrodes).super__Vector_base<NTrodeObj,_std::allocator<NTrodeObj>_>.
                     _M_impl.super__Vector_impl_data._M_finish - (long)pNVar5 >> 3) *
              -0x71c71c71c71c71c7;
      lVar6 = lVar6 + 0x48;
    } while ((long)uVar7 < (long)(int)uVar3);
  }
  return (int)this_00;
}

Assistant:

TrodesConfig* TrodesConfig::copy() const {
    TrodesConfig* newObj = new TrodesConfig();
//    TrodesConfig newObj

    for (int i = 0; i < (int)devices.size(); i++) {
        newObj->addDevice(devices.at(i));
    }
    for (int i = 0; i < (int)nTrodes.size(); i++) {
        newObj->addNTrode(nTrodes.at(i));
    }
    return(newObj);
}